

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O0

void smb_format_message(connectdata *conn,smb_header *h,uchar cmd,size_t len)

{
  void *pvVar1;
  uint16_t uVar2;
  __pid_t _Var3;
  uint pid;
  smb_request *req;
  smb_conn *smbc;
  size_t len_local;
  uchar cmd_local;
  smb_header *h_local;
  connectdata *conn_local;
  
  pvVar1 = (conn->data->req).protop;
  memset(h,0,0x24);
  uVar2 = htons((short)len + 0x20);
  h->nbt_length = uVar2;
  h->magic[0] = 0xff;
  h->magic[1] = 'S';
  h->magic[2] = 'M';
  h->magic[3] = 'B';
  h->command = cmd;
  h->flags = '\x18';
  h->flags2 = 0x41;
  h->uid = (conn->proto).smbc.uid;
  h->tid = *(unsigned_short *)((long)pvVar1 + 0x18);
  _Var3 = getpid();
  h->pid_high = (unsigned_short)((uint)_Var3 >> 0x10);
  h->pid = (unsigned_short)_Var3;
  return;
}

Assistant:

static void smb_format_message(struct connectdata *conn, struct smb_header *h,
                               unsigned char cmd, size_t len)
{
  struct smb_conn *smbc = &conn->proto.smbc;
  struct smb_request *req = conn->data->req.protop;
  unsigned int pid;

  memset(h, 0, sizeof(*h));
  h->nbt_length = htons((unsigned short) (sizeof(*h) - sizeof(unsigned int) +
                                          len));
  memcpy((char *)h->magic, "\xffSMB", 4);
  h->command = cmd;
  h->flags = SMB_FLAGS_CANONICAL_PATHNAMES | SMB_FLAGS_CASELESS_PATHNAMES;
  h->flags2 = smb_swap16(SMB_FLAGS2_IS_LONG_NAME | SMB_FLAGS2_KNOWS_LONG_NAME);
  h->uid = smb_swap16(smbc->uid);
  h->tid = smb_swap16(req->tid);
  pid = getpid();
  h->pid_high = smb_swap16((unsigned short)(pid >> 16));
  h->pid = smb_swap16((unsigned short) pid);
}